

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QVariant,void(QVariant_const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<QVariant,void(QVariant_const&)> *this,PromiseError *error)

{
  exception_ptr eStack_18;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,&error->m_data);
  std::__exception_ptr::exception_ptr::operator=((exception_ptr *)(this + 0x50),&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  PromiseDataBase<QVariant,_void_(const_QVariant_&)>::setSettled
            ((PromiseDataBase<QVariant,_void_(const_QVariant_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }